

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O1

double aom_normalized_cross_correlation(double *a,double *b,int n)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (n < 1) {
    dVar4 = 0.0;
    dVar5 = 0.0;
    dVar6 = 0.0;
  }
  else {
    dVar4 = 0.0;
    dVar5 = 0.0;
    dVar6 = 0.0;
    uVar3 = 0;
    do {
      dVar1 = b[uVar3];
      dVar6 = dVar6 + dVar1 * dVar1;
      dVar2 = a[uVar3];
      dVar4 = dVar4 + dVar2 * dVar1;
      dVar5 = dVar5 + dVar2 * dVar2;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return dVar4 / (dVar5 * dVar6);
}

Assistant:

double aom_normalized_cross_correlation(const double *a, const double *b,
                                        int n) {
  double c = 0;
  double a_len = 0;
  double b_len = 0;
  for (int i = 0; i < n; ++i) {
    a_len += a[i] * a[i];
    b_len += b[i] * b[i];
    c += a[i] * b[i];
  }
  return c / (sqrt(a_len) * sqrt(b_len));
}